

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simUtils.c
# Opt level: O0

int Sim_UtilInfoIsImp(uint *pPats1,uint *pPats2,int nSimWords)

{
  int local_28;
  int k;
  int nSimWords_local;
  uint *pPats2_local;
  uint *pPats1_local;
  
  local_28 = 0;
  while( true ) {
    if (nSimWords <= local_28) {
      return 1;
    }
    if ((pPats1[local_28] & (pPats2[local_28] ^ 0xffffffff)) != 0) break;
    local_28 = local_28 + 1;
  }
  return 0;
}

Assistant:

int Sim_UtilInfoIsImp( unsigned * pPats1, unsigned * pPats2, int nSimWords )
{
    int k;
    for ( k = 0; k < nSimWords; k++ )
        if ( pPats1[k] & ~pPats2[k] )
            return 0;
    return 1;
}